

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::log_internal::LogMessage::
CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
          (LogMessage *this,string_view str)

{
  bool bVar1;
  Span<char> *pSVar2;
  size_t sVar3;
  Span<char> *pSVar4;
  Span<char> *in_R8;
  Span<char> SVar5;
  Span<char> msg;
  Span<const_char> value;
  Span<char> encoded_remaining_copy;
  
  pSVar4 = &encoded_remaining_copy;
  pSVar2 = LogMessageData::encoded_remaining
                     ((this->data_)._M_t.
                      super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      .
                      super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                      ._M_head_impl);
  encoded_remaining_copy.ptr_ = pSVar2->ptr_;
  encoded_remaining_copy.len_ = pSVar2->len_;
  sVar3 = BufferSizeFor(6,kLengthDelimited);
  SVar5 = EncodeMessageStart(7,(uint64_t)((pointer)str._M_len + sVar3),&encoded_remaining_copy);
  value.len_ = (size_type)&encoded_remaining_copy;
  value.ptr_ = (pointer)str._M_len;
  bVar1 = EncodeBytesTruncate((log_internal *)0x6,(uint64_t)str._M_str,value,in_R8);
  if (bVar1) {
    msg.len_ = (size_type)&encoded_remaining_copy;
    msg.ptr_ = (pointer)SVar5.len_;
    EncodeMessageLength((log_internal *)SVar5.ptr_,msg,pSVar4);
    pSVar2 = LogMessageData::encoded_remaining
                       ((this->data_)._M_t.
                        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                        .
                        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                        ._M_head_impl);
    pSVar2->ptr_ = encoded_remaining_copy.ptr_;
    pSVar2->len_ = encoded_remaining_copy.len_;
  }
  else {
    pSVar2 = LogMessageData::encoded_remaining
                       ((this->data_)._M_t.
                        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                        .
                        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                        ._M_head_impl);
    pSVar4 = LogMessageData::encoded_remaining
                       ((this->data_)._M_t.
                        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                        .
                        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                        ._M_head_impl);
    Span<char>::remove_suffix(pSVar2,pSVar4->len_);
  }
  return;
}

Assistant:

void LogMessage::CopyToEncodedBuffer(absl::string_view str) {
  auto encoded_remaining_copy = data_->encoded_remaining();
  constexpr uint8_t tag_value = str_type == StringType::kLiteral
                                    ? ValueTag::kStringLiteral
                                    : ValueTag::kString;
  auto start = EncodeMessageStart(
      EventTag::kValue,
      BufferSizeFor(tag_value, WireType::kLengthDelimited) + str.size(),
      &encoded_remaining_copy);
  // If the `logging.proto.Event.value` field header did not fit,
  // `EncodeMessageStart` will have zeroed `encoded_remaining_copy`'s size and
  // `EncodeStringTruncate` will fail too.
  if (EncodeStringTruncate(tag_value, str, &encoded_remaining_copy)) {
    // The string may have been truncated, but the field header fit.
    EncodeMessageLength(start, &encoded_remaining_copy);
    data_->encoded_remaining() = encoded_remaining_copy;
  } else {
    // The field header(s) did not fit; zero `encoded_remaining()` so we don't
    // write anything else later.
    data_->encoded_remaining().remove_suffix(data_->encoded_remaining().size());
  }
}